

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O3

boolean jpeg_start_decompress(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  uint uVar3;
  boolean bVar4;
  jpeg_progress_mgr *pjVar5;
  long lVar6;
  
  iVar1 = cinfo->global_state;
  if (iVar1 != 0xcc) {
    if (iVar1 != 0xcb) {
      if (iVar1 != 0xca) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x14;
        (pjVar2->msg_parm).i[0] = iVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        goto LAB_0011c68c;
      }
      jinit_master_decompress(cinfo);
      if (cinfo->buffered_image != 0) {
        cinfo->global_state = 0xcf;
        return 1;
      }
      cinfo->global_state = 0xcb;
    }
    if (cinfo->inputctl->has_multiple_scans != 0) {
      pjVar5 = cinfo->progress;
      while( true ) {
        if (pjVar5 != (jpeg_progress_mgr *)0x0) {
          (*pjVar5->progress_monitor)((j_common_ptr)cinfo);
        }
        uVar3 = (*cinfo->inputctl->consume_input)(cinfo);
        if (uVar3 == 0) {
          return 0;
        }
        if (uVar3 == 2) break;
        pjVar5 = cinfo->progress;
        if ((uVar3 & 0xfffffffd) == 1 && pjVar5 != (jpeg_progress_mgr *)0x0) {
          lVar6 = pjVar5->pass_counter + 1;
          pjVar5->pass_counter = lVar6;
          if (pjVar5->pass_limit <= lVar6) {
            pjVar5->pass_limit = pjVar5->pass_limit + (ulong)cinfo->total_iMCU_rows;
          }
        }
      }
    }
    cinfo->output_scan_number = cinfo->input_scan_number;
  }
LAB_0011c68c:
  bVar4 = output_pass_setup(cinfo);
  return bVar4;
}

Assistant:

GLOBAL(boolean)
jpeg_start_decompress(j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize master control, select active modules */
    jinit_master_decompress(cinfo);
    if (cinfo->buffered_image) {
      /* No more work here; expecting jpeg_start_output next */
      cinfo->global_state = DSTATE_BUFIMAGE;
      return TRUE;
    }
    cinfo->global_state = DSTATE_PRELOAD;
  }
  if (cinfo->global_state == DSTATE_PRELOAD) {
    /* If file has multiple scans, absorb them all into the coef buffer */
    if (cinfo->inputctl->has_multiple_scans) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
      for (;;) {
        int retcode;
        /* Call progress monitor hook if present */
        if (cinfo->progress != NULL)
          (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
        /* Absorb some more input */
        retcode = (*cinfo->inputctl->consume_input) (cinfo);
        if (retcode == JPEG_SUSPENDED)
          return FALSE;
        if (retcode == JPEG_REACHED_EOI)
          break;
        /* Advance progress counter if appropriate */
        if (cinfo->progress != NULL &&
            (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
          if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
            /* jdmaster underestimated number of scans; ratchet up one scan */
            cinfo->progress->pass_limit += (long)cinfo->total_iMCU_rows;
          }
        }
      }
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* D_MULTISCAN_FILES_SUPPORTED */
    }
    cinfo->output_scan_number = cinfo->input_scan_number;
  } else if (cinfo->global_state != DSTATE_PRESCAN)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Perform any dummy output passes, and set up for the final pass */
  return output_pass_setup(cinfo);
}